

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvTools.cpp
# Opt level: O0

void glslang::SpirvToolsValidate
               (TIntermediate *intermediate,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,SpvBuildLogger *logger,
               bool prelegalization)

{
  char *__s;
  bool bVar1;
  spv_target_env env;
  SpvVersion *spvVersion;
  spv_validator_options psVar2;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  spv_validator_options local_50;
  spv_validator_options options;
  spv_diagnostic diagnostic;
  spv_const_binary_t binary;
  spv_context context;
  bool prelegalization_local;
  SpvBuildLogger *logger_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_local;
  TIntermediate *intermediate_local;
  
  spvVersion = TIntermediate::getSpv(intermediate);
  env = MapToSpirvToolsEnv(spvVersion,logger);
  binary.wordCount = (size_t)spvContextCreate(env);
  diagnostic = (spv_diagnostic)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(spirv)
  ;
  binary.code = (uint32_t *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(spirv);
  options = (spv_validator_options)0x0;
  psVar2 = spvValidatorOptionsCreate();
  local_50 = psVar2;
  bVar1 = TIntermediate::usingHlslOffsets(intermediate);
  spvValidatorOptionsSetRelaxBlockLayout(psVar2,bVar1);
  spvValidatorOptionsSetBeforeHlslLegalization(local_50,prelegalization);
  psVar2 = local_50;
  bVar1 = TIntermediate::usingScalarBlockLayout(intermediate);
  spvValidatorOptionsSetScalarBlockLayout(psVar2,bVar1);
  psVar2 = local_50;
  bVar1 = TIntermediate::usingScalarBlockLayout(intermediate);
  spvValidatorOptionsSetWorkgroupScalarBlockLayout(psVar2,bVar1);
  psVar2 = local_50;
  bVar1 = TIntermediate::usingTextureOffsetNonConst(intermediate);
  spvValidatorOptionsSetAllowOffsetTextureOperand(psVar2,bVar1);
  spvValidateWithOptions
            ((spv_const_context)binary.wordCount,local_50,(spv_const_binary)&diagnostic,
             (spv_diagnostic *)&options);
  if (options != (spv_validator_options)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"SPIRV-Tools Validation Errors",&local_71);
    spv::SpvBuildLogger::error(logger,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    __s = *(char **)&(options->universal_limits_).max_control_flow_nesting_depth;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,__s,&local_99);
    spv::SpvBuildLogger::error(logger,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  spvValidatorOptionsDestroy(local_50);
  spvDiagnosticDestroy((spv_diagnostic)options);
  spvContextDestroy((spv_context)binary.wordCount);
  return;
}

Assistant:

void SpirvToolsValidate(const glslang::TIntermediate& intermediate, std::vector<unsigned int>& spirv,
                        spv::SpvBuildLogger* logger, bool prelegalization)
{
    // validate
    spv_context context = spvContextCreate(MapToSpirvToolsEnv(intermediate.getSpv(), logger));
    spv_const_binary_t binary = { spirv.data(), spirv.size() };
    spv_diagnostic diagnostic = nullptr;
    spv_validator_options options = spvValidatorOptionsCreate();
    spvValidatorOptionsSetRelaxBlockLayout(options, intermediate.usingHlslOffsets());
    spvValidatorOptionsSetBeforeHlslLegalization(options, prelegalization);
    spvValidatorOptionsSetScalarBlockLayout(options, intermediate.usingScalarBlockLayout());
    spvValidatorOptionsSetWorkgroupScalarBlockLayout(options, intermediate.usingScalarBlockLayout());
    spvValidatorOptionsSetAllowOffsetTextureOperand(options, intermediate.usingTextureOffsetNonConst());
    spvValidateWithOptions(context, options, &binary, &diagnostic);

    // report
    if (diagnostic != nullptr) {
        logger->error("SPIRV-Tools Validation Errors");
        logger->error(diagnostic->error);
    }

    // tear down
    spvValidatorOptionsDestroy(options);
    spvDiagnosticDestroy(diagnostic);
    spvContextDestroy(context);
}